

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DevKkt.cpp
# Opt level: O0

void presolve::dev_kkt_check::checkStationarityOfLagrangian
               (State *state,KktConditionDetails *details)

{
  int iVar1;
  const_reference pvVar2;
  const_reference pvVar3;
  ostream *poVar4;
  undefined4 *in_RSI;
  int *in_RDI;
  double dVar5;
  HighsCDouble HVar6;
  int row;
  int k;
  HighsCDouble lagrV;
  double infeas;
  int j;
  double in_stack_ffffffffffffff88;
  HighsCDouble *in_stack_ffffffffffffff90;
  int local_44;
  HighsCDouble local_40;
  HighsCDouble local_30;
  double local_20;
  int local_14;
  undefined4 *local_10;
  int *local_8;
  
  *in_RSI = 4;
  in_RSI[6] = 0;
  in_RSI[7] = 0;
  *(undefined8 *)(in_RSI + 2) = 0;
  *(undefined8 *)(in_RSI + 4) = 0;
  local_10 = in_RSI;
  local_8 = in_RDI;
  for (local_14 = 0; local_14 < *local_8; local_14 = local_14 + 1) {
    pvVar2 = std::vector<int,_std::allocator<int>_>::operator[]
                       (*(vector<int,_std::allocator<int>_> **)(local_8 + 0x1a),(long)local_14);
    if (*pvVar2 != 0) {
      local_10[6] = local_10[6] + 1;
      local_20 = 0.0;
      pvVar3 = std::vector<double,_std::allocator<double>_>::operator[]
                         (*(vector<double,_std::allocator<double>_> **)(local_8 + 0x10),
                          (long)local_14);
      HighsCDouble::HighsCDouble(&local_40,*pvVar3);
      std::vector<double,_std::allocator<double>_>::operator[]
                (*(vector<double,_std::allocator<double>_> **)(local_8 + 0x20),(long)local_14);
      HVar6 = HighsCDouble::operator-(in_stack_ffffffffffffff90,in_stack_ffffffffffffff88);
      local_30.hi = HVar6.hi;
      local_30.lo = HVar6.lo;
      pvVar2 = std::vector<int,_std::allocator<int>_>::operator[]
                         (*(vector<int,_std::allocator<int>_> **)(local_8 + 2),(long)local_14);
      for (local_44 = *pvVar2;
          pvVar2 = std::vector<int,_std::allocator<int>_>::operator[]
                             (*(vector<int,_std::allocator<int>_> **)(local_8 + 4),(long)local_14),
          local_44 < *pvVar2; local_44 = local_44 + 1) {
        pvVar2 = std::vector<int,_std::allocator<int>_>::operator[]
                           (*(vector<int,_std::allocator<int>_> **)(local_8 + 6),(long)local_44);
        iVar1 = *pvVar2;
        pvVar2 = std::vector<int,_std::allocator<int>_>::operator[]
                           (*(vector<int,_std::allocator<int>_> **)(local_8 + 0x1c),(long)iVar1);
        if (*pvVar2 != 0) {
          std::vector<double,_std::allocator<double>_>::operator[]
                    (*(vector<double,_std::allocator<double>_> **)(local_8 + 0x24),(long)iVar1);
          std::vector<double,_std::allocator<double>_>::operator[]
                    (*(vector<double,_std::allocator<double>_> **)(local_8 + 8),(long)local_44);
          HVar6 = HighsCDouble::operator-(in_stack_ffffffffffffff90,in_stack_ffffffffffffff88);
          local_30.hi = HVar6.hi;
          local_30.lo = HVar6.lo;
        }
      }
      dVar5 = HighsCDouble::operator_cast_to_double(&local_30);
      if (1e-07 < ABS(dVar5)) {
        poVar4 = std::operator<<((ostream *)&std::cout,"Column ");
        poVar4 = (ostream *)std::ostream::operator<<(poVar4,local_14);
        poVar4 = std::operator<<(poVar4," fails stationary of Lagrangian: dL/dx");
        poVar4 = (ostream *)std::ostream::operator<<(poVar4,local_14);
        in_stack_ffffffffffffff90 = (HighsCDouble *)std::operator<<(poVar4," = ");
        dVar5 = HighsCDouble::operator_cast_to_double(&local_30);
        poVar4 = (ostream *)std::ostream::operator<<(in_stack_ffffffffffffff90,dVar5);
        poVar4 = std::operator<<(poVar4,", rather than zero.");
        std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
        local_20 = HighsCDouble::operator_cast_to_double(&local_30);
        local_20 = ABS(local_20);
      }
      if (0.0 < local_20) {
        local_10[7] = local_10[7] + 1;
        *(double *)(local_10 + 4) = local_20 * local_20 + *(double *)(local_10 + 4);
        if (*(double *)(local_10 + 2) < local_20) {
          *(double *)(local_10 + 2) = local_20;
        }
      }
    }
  }
  if (local_10[7] == 0) {
    std::operator<<((ostream *)&std::cout,"Stationarity of Lagrangian.\n");
  }
  else {
    std::operator<<((ostream *)&std::cout,"KKT check error: Lagrangian is not stationary.\n");
  }
  return;
}

Assistant:

void checkStationarityOfLagrangian(const State& state,
                                   KktConditionDetails& details) {
  details.type = KktCondition::kStationarityOfLagrangian;
  details.checked = 0;
  details.violated = 0;
  details.max_violation = 0.0;
  details.sum_violation_2 = 0.0;

  // A'y + c - z = 0
  for (int j = 0; j < state.numCol; j++) {
    if (state.flagCol[j]) {
      details.checked++;
      double infeas = 0;

      HighsCDouble lagrV = HighsCDouble(state.colCost[j]) - state.colDual[j];
      for (int k = state.Astart[j]; k < state.Aend[j]; k++) {
        const int row = state.Aindex[k];
        assert(row >= 0 && row < state.numRow);
        if (state.flagRow[row])
          lagrV = lagrV - state.rowDual[row] * state.Avalue[k];
      }

      if (fabs(double(lagrV)) > tol) {
        if (dev_print == 1)
          std::cout << "Column " << j
                    << " fails stationary of Lagrangian: dL/dx" << j << " = "
                    << double(lagrV) << ", rather than zero." << std::endl;
        infeas = fabs(double(lagrV));
      }

      if (infeas > 0) {
        details.violated++;
        details.sum_violation_2 += infeas * infeas;

        if (details.max_violation < infeas) details.max_violation = infeas;
      }
    }
  }

  if (details.violated == 0) {
    if (dev_print == 1) std::cout << "Stationarity of Lagrangian.\n";
  } else {
    if (dev_print == 1)
      std::cout << "KKT check error: Lagrangian is not stationary.\n";
  }
}